

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateEndStructMethod
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *writer,IDLOptions *options)

{
  undefined8 __s;
  anon_class_24_3_5a821194 local_160;
  function<void_()> local_148;
  allocator<char> local_121;
  string local_120;
  undefined1 local_100 [8];
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> field_vec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> returns;
  char *params;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string name;
  IDLOptions *options_local;
  CodeWriter *writer_local;
  StructDef *struct_def_local;
  KotlinKMPGenerator *this_local;
  
  name.field_2._8_8_ = options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"end",&local_69);
  Namer::Method((string *)local_48,&(this->namer_).super_Namer,&local_68,(string *)struct_def);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  returns.field_2._8_8_ = anon_var_dwarf_147934;
  IdlNamer::Type_abi_cxx11_
            ((string *)
             &field_vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&this->namer_,struct_def);
  std::operator+(&local_c8,"Offset<",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &field_vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 &local_c8,'>');
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string
            ((string *)
             &field_vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)local_100,
             &(struct_def->fields).vec);
  __s = returns.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,(char *)__s,&local_121);
  local_160.returns = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  local_160.field_vec =
       (vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)local_100;
  local_160.writer = writer;
  std::function<void()>::
  function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateEndStructMethod(flatbuffers::StructDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
            ((function<void()> *)&local_148,&local_160);
  GenerateFun(writer,(string *)local_48,&local_120,(string *)local_a8,&local_148,
              (bool)(options->gen_jvmstatic & 1));
  std::function<void_()>::~function(&local_148);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::~vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)local_100)
  ;
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void GenerateEndStructMethod(StructDef &struct_def, CodeWriter &writer,
                               const IDLOptions options) const {
    // Generate end{{TableName}}(builder: FlatBufferBuilder) method
    auto name = namer_.Method("end", struct_def.name);
    auto params = "builder: FlatBufferBuilder";
    auto returns = "Offset<" + namer_.Type(struct_def) + '>';
    auto field_vec = struct_def.fields.vec;

    GenerateFun(
        writer, name, params, returns,
        [&]() {
          writer += "val o: " + returns + " = builder.endTable()";
          writer.IncrementIdentLevel();
          for (auto it = field_vec.begin(); it != field_vec.end(); ++it) {
            auto &field = **it;
            if (field.deprecated || !field.IsRequired()) { continue; }
            writer.SetValue("offset", NumToString(field.value.offset));
            writer.SetValue("field_name", field.name);
            writer += "builder.required(o, {{offset}}, \"{{field_name}}\")";
          }
          writer.DecrementIdentLevel();
          writer += "return o";
        },
        options.gen_jvmstatic);
  }